

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<signed_char>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1
  ;
  int iVar2;
  SafeInt local_e;
  SafeInt local_d;
  SafeInt local_c;
  SafeInt local_b;
  SafeInt local_a;
  SafeInt local_9;
  
  if (ConstCastTestT<signed_char>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::b);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::b = SVar1.m_int != '\0';
      __cxa_guard_release(&ConstCastTestT<signed_char>()::b);
    }
  }
  if (ConstCastTestT<signed_char>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::w);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::w = (wchar_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::w);
    }
  }
  if (ConstCastTestT<signed_char>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::c);
    if (iVar2 != 0) {
      ConstCastTestT<signed_char>::c = (char)ConstSafeInt<signed_char>();
      __cxa_guard_release(&ConstCastTestT<signed_char>()::c);
    }
  }
  if (ConstCastTestT<signed_char>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::sc);
    if (iVar2 != 0) {
      ConstCastTestT<signed_char>::sc = (char)ConstSafeInt<signed_char>();
      __cxa_guard_release(&ConstCastTestT<signed_char>()::sc);
    }
  }
  if (ConstCastTestT<signed_char>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::uc);
    if (iVar2 != 0) {
      local_9 = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::uc = SafeInt::operator_cast_to_unsigned_char(&local_9);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::uc);
    }
  }
  if (ConstCastTestT<signed_char>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::s);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::s = (short)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::s);
    }
  }
  if (ConstCastTestT<signed_char>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::us);
    if (iVar2 != 0) {
      local_a = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::us = SafeInt::operator_cast_to_unsigned_short(&local_a);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::us);
    }
  }
  if (ConstCastTestT<signed_char>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::i);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::i = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::i);
    }
  }
  if (ConstCastTestT<signed_char>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ui);
    if (iVar2 != 0) {
      local_b = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ui = SafeInt::operator_cast_to_unsigned_int(&local_b);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ui);
    }
  }
  if (ConstCastTestT<signed_char>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::l);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::l = (long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::l);
    }
  }
  if (ConstCastTestT<signed_char>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ul);
    if (iVar2 != 0) {
      local_c = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ul = SafeInt::operator_cast_to_unsigned_long(&local_c);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ul);
    }
  }
  if (ConstCastTestT<signed_char>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ll);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ll = (longlong)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ll);
    }
  }
  if (ConstCastTestT<signed_char>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ull);
    if (iVar2 != 0) {
      local_d = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ull = SafeInt::operator_cast_to_unsigned_long_long(&local_d);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ull);
    }
  }
  if (ConstCastTestT<signed_char>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::st);
    if (iVar2 != 0) {
      local_e = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::st = SafeInt::operator_cast_to_unsigned_long(&local_e);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::st);
    }
  }
  if (ConstCastTestT<signed_char>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::pt);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::pt = (ptrdiff_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::pt);
    }
  }
  if (ConstCastTestT<signed_char>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::pl = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<signed_char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}